

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void ByteCodeGenerator::Generate
               (ParseNodeProg *pnodeProg,uint32 grfscr,ByteCodeGenerator *byteCodeGenerator,
               ParseableFunctionInfo **ppRootFunc,uint sourceIndex,bool forceNoNative,Parser *parser
               ,ScriptFunction **functionRef)

{
  ScriptContext *this;
  SourceContextInfo *this_00;
  bool bVar1;
  ThreadContext *this_01;
  Utf8SourceInfo *this_02;
  SRCINFO *this_03;
  SourceContextInfo **ppSVar2;
  PageAllocator *pageAllocator;
  ParseableFunctionInfo *pPVar3;
  FunctionBody *pFVar4;
  ScriptConfiguration *this_04;
  NativeCodeGenerator *nativeCodeGen;
  byte local_111;
  int local_fc;
  AutoFinalizeFuncInfos local_e0;
  AutoFinalizeFuncInfos autoFinalizeFuncInfos;
  ArenaAllocator localAlloc;
  SourceContextInfo *sourceContextInfo;
  Utf8SourceInfo *utf8SourceInfo;
  ThreadContext *threadContext;
  ScriptContext *scriptContext;
  ParseNodeWalker<WalkerPolicyTest> walker;
  bool forceNoNative_local;
  uint sourceIndex_local;
  ParseableFunctionInfo **ppRootFunc_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  uint32 grfscr_local;
  ParseNodeProg *pnodeProg_local;
  
  walker.super_WalkerPolicyTest.super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
  _vptr_WalkerPolicyBase._3_1_ = forceNoNative;
  walker.super_WalkerPolicyTest.super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
  _vptr_WalkerPolicyBase._4_4_ = sourceIndex;
  ParseNodeWalker<WalkerPolicyTest>::ParseNodeWalker
            ((ParseNodeWalker<WalkerPolicyTest> *)&scriptContext);
  ParseNodeWalker<WalkerPolicyTest>::Walk
            ((ParseNodeWalker<WalkerPolicyTest> *)&scriptContext,(ParseNode *)pnodeProg,
             (ParseNodeWalker<WalkerPolicyTest> *)&scriptContext);
  this = byteCodeGenerator->scriptContext;
  Js::ScriptContext::ProfileBegin(this,ByteCodePhase);
  this_01 = Js::ScriptContext::GetThreadContext(this);
  this_02 = Js::ScriptContext::GetSource
                      (this,walker.super_WalkerPolicyTest.
                            super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                            _vptr_WalkerPolicyBase._4_4_);
  byteCodeGenerator->m_utf8SourceInfo = this_02;
  this_03 = Js::Utf8SourceInfo::GetSrcInfo(this_02);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                      ((WriteBarrierPtr *)this_03);
  this_00 = *ppSVar2;
  if ((grfscr & 0x20) == 0) {
    local_fc = this_00->nextLocalFunctionId - (pnodeProg->super_ParseNodeFnc).functionId;
  }
  else {
    local_fc = 4;
  }
  Js::Utf8SourceInfo::EnsureInitialized(this_02,local_fc);
  SourceContextInfo::EnsureInitialized(this_00);
  pageAllocator = ThreadContext::GetPageAllocator(this_01);
  Memory::ArenaAllocator::ArenaAllocator
            ((ArenaAllocator *)&autoFinalizeFuncInfos,L"ByteCode",pageAllocator,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  Generate::AutoFinalizeFuncInfos::AutoFinalizeFuncInfos(&local_e0,byteCodeGenerator);
  byteCodeGenerator->parser = parser;
  SetCurrentSourceIndex
            (byteCodeGenerator,
             walker.super_WalkerPolicyTest.
             super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
             _vptr_WalkerPolicyBase._4_4_);
  Begin(byteCodeGenerator,(ArenaAllocator *)&autoFinalizeFuncInfos,grfscr,*ppRootFunc);
  byteCodeGenerator->functionRef = functionRef;
  Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
            ((ParseNode *)pnodeProg,byteCodeGenerator,Bind,AssignRegisters,(ParseNode *)0x0);
  byteCodeGenerator->forceNoNative =
       (bool)(walker.super_WalkerPolicyTest.
              super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
              _vptr_WalkerPolicyBase._3_1_ & 1);
  EmitProgram(byteCodeGenerator,pnodeProg);
  if ((byteCodeGenerator->flags & 0x400) != 0) {
    pPVar3 = GetRootFunc(byteCodeGenerator);
    pFVar4 = Js::FunctionProxy::GetFunctionBody(&pPVar3->super_FunctionProxy);
    local_111 = 1;
    if ((byteCodeGenerator->funcEscapes & 1U) == 0) {
      local_111 = pnodeProg->m_UsesArgumentsAtGlobal;
    }
    Js::FunctionBody::SetFuncEscapes(pFVar4,(bool)(local_111 & 1));
  }
  CheckDeferParseHasMaybeEscapedNestedFunc(byteCodeGenerator);
  Js::ScriptContext::ProfileEnd(this,ByteCodePhase);
  if ((byteCodeGenerator->forceNoNative & 1U) == 0) {
    this_04 = Js::ScriptContext::GetConfig(this);
    bVar1 = Js::ScriptConfiguration::IsNoNative(this_04);
    if (((!bVar1) && ((DAT_01eb89ea & 1) != 0)) && ((grfscr & 0x8000) == 0)) {
      nativeCodeGen = Js::ScriptContext::GetNativeCodeGenerator(this);
      pPVar3 = GetRootFunc(byteCodeGenerator);
      pFVar4 = Js::FunctionProxy::GetFunctionBody(&pPVar3->super_FunctionProxy);
      GenerateAllFunctions(nativeCodeGen,pFVar4);
    }
  }
  if (ppRootFunc != (ParseableFunctionInfo **)0x0) {
    pPVar3 = GetRootFunc(byteCodeGenerator);
    *ppRootFunc = pPVar3;
  }
  Generate::AutoFinalizeFuncInfos::~AutoFinalizeFuncInfos(&local_e0);
  Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)&autoFinalizeFuncInfos);
  return;
}

Assistant:

void ByteCodeGenerator::Generate(__in ParseNodeProg *pnodeProg, uint32 grfscr, __in ByteCodeGenerator* byteCodeGenerator,
    __inout Js::ParseableFunctionInfo ** ppRootFunc, __in uint sourceIndex,
    __in bool forceNoNative, __in Parser* parser, Js::ScriptFunction **functionRef)
{
#if DBG
    struct WalkerPolicyTest : public WalkerPolicyBase<bool, ParseNodeWalker<WalkerPolicyTest>*>
    {
        inline bool ContinueWalk(ResultType) { return ThreadContext::IsCurrentStackAvailable(Js::Constants::MinStackByteCodeVisitor); }
        virtual ResultType WalkChild(ParseNode *pnode, ParseNodeWalker<WalkerPolicyTest>* walker) { return ContinueWalk(true) && walker->Walk(pnode, walker); }
    };
    ParseNodeWalker<WalkerPolicyTest> walker;
    // Just walk the ast to see if our walker encounters any problems
    walker.Walk(pnodeProg, &walker);
#endif
    Js::ScriptContext * scriptContext = byteCodeGenerator->scriptContext;

#ifdef PROFILE_EXEC
    scriptContext->ProfileBegin(Js::ByteCodePhase);
#endif
    JS_ETW_INTERNAL(EventWriteJSCRIPT_BYTECODEGEN_START(scriptContext, 0));

    ThreadContext * threadContext = scriptContext->GetThreadContext();
    Js::Utf8SourceInfo * utf8SourceInfo = scriptContext->GetSource(sourceIndex);
    byteCodeGenerator->m_utf8SourceInfo = utf8SourceInfo;

    // For dynamic code, just provide a small number since that source info should have very few functions
    // For static code, the nextLocalFunctionId is a good guess of the initial size of the array to minimize reallocs
    SourceContextInfo * sourceContextInfo = utf8SourceInfo->GetSrcInfo()->sourceContextInfo;
    utf8SourceInfo->EnsureInitialized((grfscr & fscrDynamicCode) ? 4 : (sourceContextInfo->nextLocalFunctionId - pnodeProg->functionId));
    sourceContextInfo->EnsureInitialized();

    ArenaAllocator localAlloc(_u("ByteCode"), threadContext->GetPageAllocator(), Js::Throw::OutOfMemory);

    // Make sure FuncInfo's get finalized when byte code gen is done.
    struct AutoFinalizeFuncInfos {
        AutoFinalizeFuncInfos(ByteCodeGenerator * byteCodeGenerator) : byteCodeGenerator(byteCodeGenerator) {}
        ~AutoFinalizeFuncInfos() {
            if (byteCodeGenerator)
            {
                byteCodeGenerator->FinalizeFuncInfos();
            }
        }
        ByteCodeGenerator * byteCodeGenerator;
    } autoFinalizeFuncInfos(byteCodeGenerator);

    byteCodeGenerator->parser = parser;
    byteCodeGenerator->SetCurrentSourceIndex(sourceIndex);
    byteCodeGenerator->Begin(&localAlloc, grfscr, *ppRootFunc);
    byteCodeGenerator->functionRef = functionRef;
    Visit(pnodeProg, byteCodeGenerator, Bind, AssignRegisters);

    byteCodeGenerator->forceNoNative = forceNoNative;
    byteCodeGenerator->EmitProgram(pnodeProg);

    if (byteCodeGenerator->flags & fscrEval)
    {
        // The eval caller's frame always escapes if eval refers to the caller's arguments.
        byteCodeGenerator->GetRootFunc()->GetFunctionBody()->SetFuncEscapes(
            byteCodeGenerator->funcEscapes || pnodeProg->m_UsesArgumentsAtGlobal);
    }

#ifdef IR_VIEWER
    if (grfscr & fscrIrDumpEnable)
    {
        byteCodeGenerator->GetRootFunc()->GetFunctionBody()->SetIRDumpEnabled(true);
    }
#endif /* IR_VIEWER */

    byteCodeGenerator->CheckDeferParseHasMaybeEscapedNestedFunc();

#ifdef PROFILE_EXEC
    scriptContext->ProfileEnd(Js::ByteCodePhase);
#endif
    JS_ETW_INTERNAL(EventWriteJSCRIPT_BYTECODEGEN_STOP(scriptContext, 0));

#if ENABLE_NATIVE_CODEGEN && defined(ENABLE_PREJIT)
    if (!byteCodeGenerator->forceNoNative && !scriptContext->GetConfig()->IsNoNative()
        && Js::Configuration::Global.flags.Prejit
        && (grfscr & fscrNoPreJit) == 0)
    {
        GenerateAllFunctions(scriptContext->GetNativeCodeGenerator(), byteCodeGenerator->GetRootFunc()->GetFunctionBody());
    }
#endif

    if (ppRootFunc)
    {
        *ppRootFunc = byteCodeGenerator->GetRootFunc();
    }

#ifdef PERF_COUNTERS
    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: deferparse - # of func: %d # deferparsed: %d\n"),
        PerfCounter::CodeCounterSet::GetTotalFunctionCounter().GetValue(), PerfCounter::CodeCounterSet::GetDeferredFunctionCounter().GetValue());
#endif
}